

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeMemAllocHost
          (ze_context_handle_t hContext,ze_host_mem_alloc_desc_t *host_desc,size_t size,
          size_t alignment,void **pptr)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer this_00;
  size_type sStack_a0;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnMemAllocHost_t pfnAllocHost;
  allocator local_59;
  string local_58 [32];
  void **local_38;
  void **pptr_local;
  size_t alignment_local;
  size_t size_local;
  ze_host_mem_alloc_desc_t *host_desc_local;
  ze_context_handle_t hContext_local;
  
  local_38 = pptr;
  pptr_local = (void **)alignment;
  alignment_local = size;
  size_local = (size_t)host_desc;
  host_desc_local = (ze_host_mem_alloc_desc_t *)hContext;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"zeMemAllocHost(hContext, host_desc, size, alignment, pptr)",&local_59);
  loader::Logger::log_trace(this,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = *(code **)(context + 0x3c8);
  if (pcVar1 == (code *)0x0) {
    hContext_local._4_4_ =
         logAndPropagateResult("zeMemAllocHost",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0xb8])
                        ((*ppvVar4)->zeValidation,host_desc_local,size_local,alignment_local,
                         pptr_local,local_38);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeMemAllocHost",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeMemAllocHostPrologue
                        (&this_00->zeHandleLifetime,(ze_context_handle_t)host_desc_local,
                         (ze_host_mem_alloc_desc_t *)size_local,alignment_local,(size_t)pptr_local,
                         local_38);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeMemAllocHost",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(host_desc_local,size_local,alignment_local,pptr_local,local_38);
    for (sStack_a0 = 0; sStack_a0 < sVar3; sStack_a0 = sStack_a0 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_a0);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0xb9])
                            ((*ppvVar4)->zeValidation,host_desc_local,size_local,alignment_local,
                             pptr_local,local_38,zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeMemAllocHost",result_00);
        return zVar2;
      }
    }
    hContext_local._4_4_ = logAndPropagateResult("zeMemAllocHost",zVar2);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemAllocHost(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        void** pptr                                     ///< [out] pointer to host allocation
        )
    {
        context.logger->log_trace("zeMemAllocHost(hContext, host_desc, size, alignment, pptr)");

        auto pfnAllocHost = context.zeDdiTable.Mem.pfnAllocHost;

        if( nullptr == pfnAllocHost )
            return logAndPropagateResult("zeMemAllocHost", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocHostPrologue( hContext, host_desc, size, alignment, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemAllocHostPrologue( hContext, host_desc, size, alignment, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }

        auto driver_result = pfnAllocHost( hContext, host_desc, size, alignment, pptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocHostEpilogue( hContext, host_desc, size, alignment, pptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }

        return logAndPropagateResult("zeMemAllocHost", driver_result);
    }